

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O0

int64_t av1_block_error_avx2(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 *in_RCX;
  long in_RDX;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i zero_reg;
  int i;
  int64_t sse;
  __m128i ssz_reg128;
  __m128i sse_reg128;
  __m256i ssz_reg_64hi;
  __m256i sse_reg_64hi;
  __m256i exp_coeff_hi;
  __m256i exp_coeff_lo;
  __m256i exp_dqcoeff_hi;
  __m256i exp_dqcoeff_lo;
  __m256i dqcoeff_reg;
  __m256i coeff_reg;
  __m256i ssz_reg;
  __m256i sse_reg;
  undefined4 local_62c;
  undefined8 local_610;
  undefined1 in_stack_fffffffffffffa00 [32];
  tran_low_t *in_stack_fffffffffffffa20;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  
  local_4e0 = ZEXT832(0);
  local_500 = ZEXT832(0);
  for (local_62c = 0; local_62c < in_RDX; local_62c = local_62c + 0x10) {
    read_coeff(in_stack_fffffffffffffa20,in_stack_fffffffffffffa00._24_8_,
               in_stack_fffffffffffffa00._16_8_);
    read_coeff(in_stack_fffffffffffffa20,in_stack_fffffffffffffa00._24_8_,
               in_stack_fffffffffffffa00._16_8_);
    auVar5 = vpsubw_avx2(local_540,local_520);
    local_540 = vpmaddwd_avx2(auVar5,auVar5);
    local_520 = vpmaddwd_avx2(local_520,local_520);
    auVar5 = vpunpckldq_avx2(local_540,ZEXT832(0));
    auVar3 = vpunpckhdq_avx2(local_540,ZEXT832(0));
    auVar6 = vpunpckldq_avx2(local_520,ZEXT832(0));
    auVar4 = vpunpckhdq_avx2(local_520,ZEXT832(0));
    auVar5 = vpaddq_avx2(local_4e0,auVar5);
    auVar6 = vpaddq_avx2(local_500,auVar6);
    local_4e0 = vpaddq_avx2(auVar5,auVar3);
    local_500 = vpaddq_avx2(auVar6,auVar4);
  }
  auVar5 = vpsrldq_avx2(local_4e0,8);
  auVar6 = vpsrldq_avx2(local_500,8);
  auVar5 = vpaddq_avx2(local_4e0,auVar5);
  auVar6 = vpaddq_avx2(local_500,auVar6);
  auVar1 = vpaddq_avx(auVar5._0_16_,auVar5._16_16_);
  auVar2 = vpaddq_avx(auVar6._0_16_,auVar6._16_16_);
  local_610 = auVar1._0_8_;
  *in_RCX = auVar2._0_8_;
  return local_610;
}

Assistant:

int64_t av1_block_error_avx2(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                             intptr_t block_size, int64_t *ssz) {
  __m256i sse_reg, ssz_reg, coeff_reg, dqcoeff_reg;
  __m256i exp_dqcoeff_lo, exp_dqcoeff_hi, exp_coeff_lo, exp_coeff_hi;
  __m256i sse_reg_64hi, ssz_reg_64hi;
  __m128i sse_reg128, ssz_reg128;
  int64_t sse;
  int i;
  const __m256i zero_reg = _mm256_setzero_si256();

  // init sse and ssz registerd to zero
  sse_reg = _mm256_setzero_si256();
  ssz_reg = _mm256_setzero_si256();

  for (i = 0; i < block_size; i += 16) {
    // load 32 bytes from coeff and dqcoeff
    read_coeff(coeff, i, &coeff_reg);
    read_coeff(dqcoeff, i, &dqcoeff_reg);
    // dqcoeff - coeff
    dqcoeff_reg = _mm256_sub_epi16(dqcoeff_reg, coeff_reg);
    // madd (dqcoeff - coeff)
    dqcoeff_reg = _mm256_madd_epi16(dqcoeff_reg, dqcoeff_reg);
    // madd coeff
    coeff_reg = _mm256_madd_epi16(coeff_reg, coeff_reg);
    // expand each double word of madd (dqcoeff - coeff) to quad word
    exp_dqcoeff_lo = _mm256_unpacklo_epi32(dqcoeff_reg, zero_reg);
    exp_dqcoeff_hi = _mm256_unpackhi_epi32(dqcoeff_reg, zero_reg);
    // expand each double word of madd (coeff) to quad word
    exp_coeff_lo = _mm256_unpacklo_epi32(coeff_reg, zero_reg);
    exp_coeff_hi = _mm256_unpackhi_epi32(coeff_reg, zero_reg);
    // add each quad word of madd (dqcoeff - coeff) and madd (coeff)
    sse_reg = _mm256_add_epi64(sse_reg, exp_dqcoeff_lo);
    ssz_reg = _mm256_add_epi64(ssz_reg, exp_coeff_lo);
    sse_reg = _mm256_add_epi64(sse_reg, exp_dqcoeff_hi);
    ssz_reg = _mm256_add_epi64(ssz_reg, exp_coeff_hi);
  }
  // save the higher 64 bit of each 128 bit lane
  sse_reg_64hi = _mm256_srli_si256(sse_reg, 8);
  ssz_reg_64hi = _mm256_srli_si256(ssz_reg, 8);
  // add the higher 64 bit to the low 64 bit
  sse_reg = _mm256_add_epi64(sse_reg, sse_reg_64hi);
  ssz_reg = _mm256_add_epi64(ssz_reg, ssz_reg_64hi);

  // add each 64 bit from each of the 128 bit lane of the 256 bit
  sse_reg128 = _mm_add_epi64(_mm256_castsi256_si128(sse_reg),
                             _mm256_extractf128_si256(sse_reg, 1));

  ssz_reg128 = _mm_add_epi64(_mm256_castsi256_si128(ssz_reg),
                             _mm256_extractf128_si256(ssz_reg, 1));

  // store the results
  _mm_storel_epi64((__m128i *)(&sse), sse_reg128);

  _mm_storel_epi64((__m128i *)(ssz), ssz_reg128);
  _mm256_zeroupper();
  return sse;
}